

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O0

void __thiscall
soplex::SPxBoundFlippingRT<double>::collectBreakpointsMax
          (SPxBoundFlippingRT<double> *this,int *nBp,int *minIdx,int *idx,int nnz,double *upd,
          double *vec,double *upp,double *low,BreakpointSource src)

{
  double dVar1;
  BreakpointSource BVar2;
  int iVar3;
  double *pdVar4;
  Breakpoint *pBVar5;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  SPxFastRT<double> *in_RDI;
  int in_R8D;
  long in_R9;
  double dVar6;
  long in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  BreakpointSource in_stack_00000020;
  double y_1;
  double y;
  double x;
  int i;
  int *last;
  double curVal;
  double minVal;
  int in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  double local_b8;
  double local_90;
  double local_78;
  double local_38;
  int *local_20;
  
  if (*in_RSI == 0) {
    pdVar4 = (double *)infinity();
    local_78 = *pdVar4;
  }
  else {
    pBVar5 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                       ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)
                        CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                        in_stack_ffffffffffffff2c);
    local_78 = pBVar5->val;
  }
  local_38 = local_78;
  for (local_20 = in_RCX; local_20 < in_RCX + in_R8D; local_20 = local_20 + 1) {
    iVar3 = *local_20;
    dVar1 = *(double *)(in_R9 + (long)iVar3 * 8);
    dVar6 = SPxFastRT<double>::epsilonZero(in_RDI);
    if (dVar1 <= dVar6) {
      dVar6 = SPxFastRT<double>::epsilonZero(in_RDI);
      if ((dVar1 < -dVar6) &&
         (dVar6 = *(double *)(in_stack_00000018 + (long)iVar3 * 8), pdVar4 = (double *)infinity(),
         -*pdVar4 < dVar6)) {
        local_b8 = *(double *)(in_stack_00000018 + (long)iVar3 * 8) -
                   *(double *)(in_stack_00000008 + (long)iVar3 * 8);
        if (local_b8 < 0.0) {
          local_b8 = local_b8 - in_RDI->fastDelta;
        }
        else {
          local_b8 = -in_RDI->fastDelta;
        }
        local_b8 = local_b8 / dVar1;
        pBVar5 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                           ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)
                            CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                            in_stack_ffffffffffffff2c);
        BVar2 = in_stack_00000020;
        pBVar5->idx = iVar3;
        pBVar5 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                           ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)
                            CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                            in_stack_ffffffffffffff2c);
        pBVar5->src = BVar2;
        pBVar5 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                           ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)
                            CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                            in_stack_ffffffffffffff2c);
        pBVar5->val = local_b8;
        if (local_b8 < local_38) {
          local_38 = local_b8;
          *in_RDX = *in_RSI;
        }
        *in_RSI = *in_RSI + 1;
      }
    }
    else {
      dVar6 = *(double *)(in_stack_00000010 + (long)iVar3 * 8);
      pdVar4 = (double *)infinity();
      if (dVar6 < *pdVar4) {
        local_90 = *(double *)(in_stack_00000010 + (long)iVar3 * 8) -
                   *(double *)(in_stack_00000008 + (long)iVar3 * 8);
        if (0.0 < local_90) {
          local_90 = local_90 + in_RDI->fastDelta;
        }
        else {
          local_90 = in_RDI->fastDelta;
        }
        local_90 = local_90 / dVar1;
        pBVar5 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                           ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)
                            CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                            in_stack_ffffffffffffff2c);
        BVar2 = in_stack_00000020;
        pBVar5->idx = iVar3;
        pBVar5 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                           ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)
                            CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                            in_stack_ffffffffffffff2c);
        pBVar5->src = BVar2;
        pBVar5 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                           ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)
                            CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                            in_stack_ffffffffffffff2c);
        pBVar5->val = local_90;
        if (local_90 < local_38) {
          local_38 = local_90;
          *in_RDX = *in_RSI;
        }
        *in_RSI = *in_RSI + 1;
      }
    }
    in_stack_ffffffffffffff34 = *in_RSI;
    iVar3 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::size
                      ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)0x2fa4bd);
    if (iVar3 <= in_stack_ffffffffffffff34) {
      Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::reSize
                ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)
                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff2c);
    }
  }
  return;
}

Assistant:

void SPxBoundFlippingRT<R>::collectBreakpointsMax(
   int&                  nBp,                /**< number of found breakpoints so far */
   int&                  minIdx,             /**< index to current minimal breakpoint */
   const int*            idx,                /**< pointer to indices of current VectorBase<R> */
   int                   nnz,                /**< number of nonzeros in current VectorBase<R> */
   const R*           upd,                /**< pointer to update values of current VectorBase<R> */
   const R*           vec,                /**< pointer to values of current VectorBase<R> */
   const R*           upp,                /**< pointer to upper bound/rhs of current VectorBase<R> */
   const R*           low,                /**< pointer to lower bound/lhs of current VectorBase<R> */
   BreakpointSource      src                 /**< type of VectorBase<R> (pVec, coPvec or fVec)*/
)
{
   R minVal;
   R curVal;
   const int* last;

   minVal = (nBp == 0) ? R(infinity) : breakpoints[minIdx].val;

   last = idx + nnz;

   for(; idx < last; ++idx)
   {
      int i = *idx;
      R x = upd[i];

      if(x > this->epsilonZero())
      {
         if(upp[i] < R(infinity))
         {
            R y = upp[i] - vec[i];
            curVal = (y <= 0) ? this->fastDelta / x : (y + this->fastDelta) / x;
            assert(curVal > 0);

            breakpoints[nBp].idx = i;
            breakpoints[nBp].src = src;
            breakpoints[nBp].val = curVal;

            if(curVal < minVal)
            {
               minVal = curVal;
               minIdx = nBp;
            }

            nBp++;
         }
      }
      else if(x < -this->epsilonZero())
      {
         if(low[i] > R(-infinity))
         {
            R y = low[i] - vec[i];
            curVal = (y >= 0) ? -this->fastDelta / x : (y - this->fastDelta) / x;
            assert(curVal > 0);

            breakpoints[nBp].idx = i;
            breakpoints[nBp].src = src;
            breakpoints[nBp].val = curVal;

            if(curVal < minVal)
            {
               minVal = curVal;
               minIdx = nBp;
            }

            nBp++;
         }
      }

      if(nBp >= breakpoints.size())
         breakpoints.reSize(nBp * 2);
   }

   return;
}